

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O0

long __thiscall
cubeb_client::user_data_cb
          (cubeb_client *this,cubeb_stream *stm,void *user,void *input_buffer,void *output_buffer,
          long nframes)

{
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  __int_type _Var4;
  long in_RCX;
  long in_RDI;
  long in_R8;
  long in_R9;
  uint32_t j_2;
  int32_t i_1;
  uint32_t j_1;
  uint32_t j;
  uint32_t clock;
  int32_t i;
  float *out;
  float *in;
  uint32_t in_stack_ffffffffffffff48;
  __int_type in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int iVar5;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar6;
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  int local_4c;
  long local_8;
  
  uVar3 = (uint32_t)in_R9;
  if ((in_RCX == 0) || (in_R8 == 0)) {
    if ((in_R8 != 0) && (in_RCX == 0)) {
      in_stack_ffffffffffffff48 = uVar3;
      in_stack_ffffffffffffff4c =
           std::__atomic_base::operator_cast_to_unsigned_int
                     ((__atomic_base<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff4c,uVar3));
      std::__atomic_base::operator_cast_to_unsigned_int
                ((__atomic_base<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      fill_with_sine_tone((float *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                          (uint32_t)((ulong)in_R8 >> 0x20),(uint32_t)in_R8);
    }
  }
  else {
    bVar2 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                      );
    if (bVar2) {
      for (local_4c = 0; local_4c < in_R9; local_4c = local_4c + 1) {
        iVar5 = *(int *)(in_RDI + 100);
        _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                          ((__atomic_base<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        if ((uint)(iVar5 + local_4c) % _Var4 == 0) {
          for (local_54 = 0;
              _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                                ((__atomic_base<unsigned_int> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
              local_54 < _Var4; local_54 = local_54 + 1) {
            fVar1 = *(float *)(in_RCX + (long)local_4c * 4);
            _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                              ((__atomic_base<unsigned_int> *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            *(float *)(in_R8 + (ulong)(local_4c * _Var4 + local_54) * 4) = fVar1 * 0.5 + 1.0;
          }
        }
        else {
          for (local_58 = 0;
              _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                                ((__atomic_base<unsigned_int> *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
              local_58 < _Var4; local_58 = local_58 + 1) {
            fVar1 = *(float *)(in_RCX + (long)local_4c * 4);
            _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                              ((__atomic_base<unsigned_int> *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            *(float *)(in_R8 + (ulong)(local_4c * _Var4 + local_58) * 4) = fVar1 * 0.5 + 0.0;
          }
        }
      }
    }
    else {
      for (local_5c = 0; local_5c < in_R9; local_5c = local_5c + 1) {
        for (local_60 = 0;
            _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                              ((__atomic_base<unsigned_int> *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
            local_60 < _Var4; local_60 = local_60 + 1) {
          uVar6 = *(undefined4 *)(in_RCX + (long)local_5c * 4);
          iVar5 = local_5c;
          _Var4 = std::__atomic_base::operator_cast_to_unsigned_int
                            ((__atomic_base<unsigned_int> *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          *(undefined4 *)(in_R8 + (ulong)(iVar5 * _Var4 + local_60) * 4) = uVar6;
        }
      }
    }
  }
  *(uint32_t *)(in_RDI + 100) = *(int *)(in_RDI + 100) + uVar3;
  bVar2 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_8 = in_R9;
  if (bVar2) {
    local_8 = in_R9 + -1;
  }
  return local_8;
}

Assistant:

long cubeb_client::user_data_cb(cubeb_stream* stm, void* user,
                                const void* input_buffer, void* output_buffer,
                                long nframes) {
  if (input_buffer && output_buffer) {
    const float* in = static_cast<const float*>(input_buffer);
    float* out = static_cast<float*>(output_buffer);
    if (_latency_testing) {
      for (int32_t i = 0; i < nframes; i++) {
        // Impulses every second, mixed with the input signal fed back at half
        // gain, to measure the input-to-output latency via feedback.
        uint32_t clock = ((_total_frames + i) % _rate);
        if (!clock) {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 1.0 + in[i] * 0.5;
          }
        } else {
          for (uint32_t j = 0; j < _channels; j++) {
            out[i * _channels + j] = 0.0 + in[i] * 0.5;
          }
        }
      }
    } else {
      for (int32_t i = 0; i < nframes; i++) {
        for (uint32_t j = 0; j < _channels; j++) {
          out[i * _channels + j] = in[i];
        }
      }
    }
  } else if (output_buffer && !input_buffer) {
    fill_with_sine_tone(static_cast<float*>(output_buffer), nframes, _channels,
                       _rate, _total_frames);
  }

  _total_frames += nframes;

  if (_force_drain) {
    return nframes - 1;
  }

  return nframes;
}